

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scrolling_group.cpp
# Opt level: O1

int scroll_clip_width_proc(Am_Object *self)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  Am_Value *pAVar4;
  Am_Widget_Look look;
  Am_Object v_scroller;
  Am_Widget_Look local_2c;
  Am_Object local_28;
  
  iVar2 = get_scroll_border_thickness(self);
  pAVar4 = Am_Object::Get(self,0x66,0);
  iVar3 = Am_Value::operator_cast_to_int(pAVar4);
  iVar3 = iVar3 + iVar2 * -2;
  pAVar4 = Am_Object::Get(self,0x18b,0);
  bVar1 = Am_Value::operator_cast_to_bool(pAVar4);
  if (bVar1) {
    Am_Object::Get_Object(&local_28,(Am_Slot_Key)self,0x1c4);
    pAVar4 = Am_Object::Get(&local_28,0x17f,0);
    local_2c.value = Am_MOTIF_LOOK_val;
    if ((pAVar4->type != 1) && (pAVar4->type != Am_Widget_Look::Am_Widget_Look_ID)) {
      Am_Widget_Look::TypeError(&local_2c,pAVar4);
    }
    local_2c.value = (Am_Widget_Look_vals)(pAVar4->value).float_value;
    bVar1 = Am_MOTIF_LOOK.value == local_2c.value;
    pAVar4 = Am_Object::Get(&local_28,0x66,0);
    iVar2 = Am_Value::operator_cast_to_int(pAVar4);
    iVar3 = ((iVar3 + (uint)bVar1 * 4) - iVar2) + -2;
    Am_Object::~Am_Object(&local_28);
  }
  return iVar3;
}

Assistant:

Am_Define_Formula(int, scroll_clip_width)
{
  int borderwidth = 2 * get_scroll_border_thickness(self);
  int group_width = (int)self.Get(Am_WIDTH) - borderwidth;
  if ((bool)self.Get(Am_V_SCROLL_BAR)) {
    Am_Object v_scroller = self.Get_Object(Am_V_SCROLLER);
    Am_Widget_Look look = v_scroller.Get(Am_WIDGET_LOOK);
    int extra_width = (look == Am_MOTIF_LOOK) ? 4 : 0;
    return group_width - (int)v_scroller.Get(Am_WIDTH) + extra_width -
           SCROLL_MARGIN;
  } else
    return group_width;
}